

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

bool WindowedKeyTest<Blob<66>,unsigned_int>
               (hashfunc<unsigned_int> hash,int windowbits,bool testCollision,bool testDistribution,
               bool drawDiagram)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  Blob<66> key;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  ulong local_70;
  undefined1 local_68;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  pfHash local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  uVar4 = 1 << (windowbits & 0x1fU);
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = hash.m_hash;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_48,(long)(int)uVar4);
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x48,
         (ulong)(uint)windowbits,0x48);
  local_58 = (uint)testCollision;
  uVar1 = 1;
  if (1 < (int)uVar4) {
    uVar1 = uVar4;
  }
  bVar3 = true;
  local_54 = (uint)drawDiagram;
  uVar4 = 0;
  local_60 = windowbits;
  local_5c = (uint)testDistribution;
  do {
    local_68 = 0;
    local_70 = 0;
    if (local_60 != 0x1f) {
      uVar5 = 0;
      lVar6 = 0;
      do {
        local_68 = 0;
        local_70 = (ulong)uVar5;
        lrot8(&local_70,9,uVar4);
        (*local_50)(&local_70,9,0,
                    (void *)((long)local_48.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar6));
        lVar6 = lVar6 + 4;
        uVar5 = uVar5 + 1;
      } while ((ulong)uVar1 * 4 != lVar6);
    }
    printf("Window at %3d - ",(ulong)uVar4);
    bVar2 = TestHashList<unsigned_int>
                      (&local_48,SUB41(local_54,0),SUB41(local_58,0),SUB41(local_5c,0),false,false);
    uVar4 = uVar4 + 1;
    bVar3 = (bool)(bVar3 & bVar2);
  } while (uVar4 != 0x49);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, const int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  const int keycount = 1 << windowbits;

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;

  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;

    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;

      lrot(&key,sizeof(keytype),minbit);

      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);

    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);

    //printf("\n");
  }

  return result;
}